

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntercCommand.cpp
# Opt level: O0

void __thiscall EntercCommand::doCommand(EntercCommand *this)

{
  char local_19;
  unsigned_long uStack_18;
  char dummy;
  unsigned_long index;
  EntercCommand *this_local;
  
  index = (unsigned_long)this;
  uStack_18 = DataCommands::getIndex(this->dataCommands);
  uStack_18 = uStack_18 + 1;
  fflush(_stdin);
  std::operator>>((istream *)&std::cin,&local_19);
  fflush(_stdin);
  DataCommands::setIndex(this->dataCommands,uStack_18);
  return;
}

Assistant:

void EntercCommand::doCommand() {
    // get the index from dataCommands
    unsigned long index = this->dataCommands->getIndex();
    // skip the command
    index++;

    fflush(stdin);
    char dummy;
    cin >> dummy;
    fflush(stdin);

    // set the new index of dataCommands
    this->dataCommands->setIndex(index);
}